

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O3

int tinyusdz::USDZResolveAsset
              (char *asset_name,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *search_paths,string *resolved_asset_name,string *err,void *userdata)

{
  _Alloc_hider _Var1;
  long *plVar2;
  int iVar3;
  size_t sVar4;
  const_iterator cVar5;
  bool bVar6;
  string asset_path;
  key_type local_90;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  if (((userdata == (void *)0x0) || (asset_name == (char *)0x0)) ||
     (resolved_asset_name == (string *)0x0)) {
    iVar3 = -2;
    if (err != (string *)0x0) {
      iVar3 = -2;
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    sVar4 = strlen(asset_name);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,asset_name,asset_name + sVar4);
    local_70 = local_60;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"./","");
    plVar2 = local_70;
    if (local_90._M_string_length < local_68) {
      bVar6 = false;
    }
    else if (local_68 == 0) {
      bVar6 = true;
    }
    else {
      iVar3 = bcmp(local_70,local_90._M_dataplus._M_p,local_68);
      bVar6 = iVar3 == 0;
    }
    if (plVar2 != local_60) {
      operator_delete(plVar2,local_60[0] + 1);
    }
    if (bVar6) {
      local_50 = local_40;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"./","");
      _Var1._M_p = local_90._M_dataplus._M_p;
      if ((local_90._M_string_length < local_48) ||
         ((local_48 != 0 && (iVar3 = bcmp(local_50,local_90._M_dataplus._M_p,local_48), iVar3 != 0))
         )) {
        local_70 = local_60;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,_Var1._M_p,_Var1._M_p + local_90._M_string_length);
      }
      else {
        ::std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_90);
      }
      ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
    }
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                    *)userdata,&local_90);
    if (cVar5._M_node == (_Base_ptr)((long)userdata + 8)) {
      iVar3 = -1;
    }
    else {
      ::std::__cxx11::string::_M_assign((string *)resolved_asset_name);
      iVar3 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar3;
}

Assistant:

int USDZResolveAsset(const char *asset_name, const std::vector<std::string> &search_paths, std::string *resolved_asset_name, std::string *err, void *userdata) {

  DCOUT("Resolve asset: " << asset_name);

  if (!userdata) {
    if (err) {
      (*err) += "`userdata` must be non-null.\n";
    }
    return -2;
  }

  if (!asset_name) {
    if (err) {
      (*err) += "`asset_name` must be non-null.\n";
    }
    return -2;
  }

  if (!resolved_asset_name) {
    if (err) {
      (*err) += "`resolved_asset_name` must be non-null.\n";
    }
    return -2;
  }

  std::string asset_path = asset_name;

  // Remove relative path prefix './'
  if (tinyusdz::startsWith(asset_path, "./")) {
    asset_path = tinyusdz::removePrefix(asset_path, "./");
  }

  // Not used
  (void)search_paths;

  const USDZAsset *passet = reinterpret_cast<const USDZAsset *>(userdata);

  if (passet->asset_map.count(asset_path)) {
    DCOUT("Resolved asset: " << asset_name << " as " << asset_path);
    (*resolved_asset_name) = asset_path;
    return 0;
  }

  return -1; // not found
}